

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O0

void fe::operations::applyOperationT<fe::operations::op_blit,fe::PixelR8G8B8A8,fe::PixelA8>
               (op_blit *op,PixelR8G8B8A8 *srcPixelFormat,PixelA8 *destPixelFormat,ImageData *src,
               ImageData *dest)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int local_64;
  uchar *puStack_60;
  int x;
  uchar *destLine;
  uchar *srcLine;
  int y;
  int h;
  int w;
  uchar *destBuffer;
  uchar *srcBuffer;
  ImageData *dest_local;
  ImageData *src_local;
  PixelA8 *destPixelFormat_local;
  PixelR8G8B8A8 *srcPixelFormat_local;
  op_blit *op_local;
  
  bVar3 = check(src,dest);
  if (bVar3) {
    destBuffer = (src->super_fe_image).data;
    _h = (dest->super_fe_image).data;
    iVar1 = (dest->super_fe_image).w;
    iVar2 = (dest->super_fe_image).h;
    for (srcLine._4_4_ = 0; srcLine._4_4_ != iVar2; srcLine._4_4_ = srcLine._4_4_ + 1) {
      destLine = destBuffer;
      puStack_60 = _h;
      for (local_64 = 0; local_64 != iVar1; local_64 = local_64 + 1) {
        op_blit::operator()(op,srcPixelFormat,destPixelFormat,destLine,puStack_60,local_64,
                            srcLine._4_4_);
        puStack_60 = puStack_60 + (dest->super_fe_image).bytespp;
        destLine = destLine + (src->super_fe_image).bytespp;
      }
      destBuffer = destBuffer + (src->super_fe_image).pitch;
      _h = _h + (dest->super_fe_image).pitch;
    }
  }
  return;
}

Assistant:

void applyOperationT(const Op& op, const Src& srcPixelFormat, Dest& destPixelFormat, const ImageData& src, const ImageData& dest)
        {
            if (!check(src, dest))
                return;

            const unsigned char* srcBuffer = (unsigned char*)src.data;
            unsigned char* destBuffer = (unsigned char*)dest.data;

            int w = dest.w;
            int h = dest.h;

            for (int y = 0; y != h; ++y)
            {
                const unsigned char* srcLine = srcBuffer;
                unsigned char* destLine = destBuffer;

                for (int x = 0; x != w; ++x)
                {
                    op(srcPixelFormat, destPixelFormat, srcLine, destLine, x, y);

                    destLine += dest.bytespp;
                    srcLine += src.bytespp;
                }

                srcBuffer += src.pitch;
                destBuffer += dest.pitch;
            }
        }